

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_fadeout(DUMB_IT_SIGDATA *sigdata,IT_PLAYING *playing)

{
  IT_PLAYING *playing_local;
  DUMB_IT_SIGDATA *sigdata_local;
  
  if ((((playing->flags & 4U) != 0) &&
      (playing->fadeoutcount = playing->fadeoutcount - playing->env_instrument->fadeout,
      playing->fadeoutcount < 1)) && (playing->fadeoutcount = 0, (sigdata->flags & 0x40U) == 0)) {
    playing->flags = playing->flags | 8;
  }
  return;
}

Assistant:

static void update_fadeout(DUMB_IT_SIGDATA *sigdata, IT_PLAYING *playing)
{
	if (playing->flags & IT_PLAYING_FADING) {
		playing->fadeoutcount -= playing->env_instrument->fadeout;
		if (playing->fadeoutcount <= 0) {
			playing->fadeoutcount = 0;
			if (!(sigdata->flags & IT_WAS_AN_XM))
				playing->flags |= IT_PLAYING_DEAD;
		}
	}
}